

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

void __thiscall CChat::OnMapLoad(CChat *this)

{
  long lVar1;
  int iVar2;
  IClient *pIVar3;
  char *pcVar4;
  undefined4 extraout_var;
  char *in_RDI;
  long in_FS_OFFSET;
  char aBuf [256];
  char local_108 [100];
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  CChat *in_stack_ffffffffffffff70;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar4 = in_RDI;
  pIVar3 = CComponent::Client((CComponent *)0x14c8d0);
  iVar2 = IClient::State(pIVar3);
  if (iVar2 == 2) {
    if ((in_RDI[0x25d68] & 1U) == 0) {
      pcVar4 = Localize(pcVar4,in_RDI);
      pIVar3 = CComponent::Client((CComponent *)0x14c928);
      iVar2 = (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])();
      str_format(local_108,0x100,pcVar4,CONCAT44(extraout_var,iVar2));
      AddLine(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
              in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    }
    else {
      in_RDI[0x25d68] = '\0';
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CChat::OnMapLoad()
{
	if(Client()->State() == IClient::STATE_LOADING)
	{
		if(m_FirstMap)
			m_FirstMap = false;
		else
		{
			// display map rotation marker in chat
			char aBuf[256];
			str_format(aBuf, sizeof(aBuf), Localize("Map changed to '%s'"), Client()->GetCurrentMapName());
			AddLine(aBuf, CLIENT_MSG, CHAT_ALL);
		}
	}
}